

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O3

QColor QColor::fromRgba(QRgb rgba)

{
  QColor QVar1;
  
  QVar1 = fromRgb(rgba >> 0x10 & 0xff,rgba >> 8 & 0xff,rgba & 0xff,rgba >> 0x18);
  QVar1._8_8_ = QVar1._8_8_ & 0xffffffffffff;
  return QVar1;
}

Assistant:

QColor QColor::fromRgba(QRgb rgba) noexcept
{
    return fromRgb(qRed(rgba), qGreen(rgba), qBlue(rgba), qAlpha(rgba));
}